

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *jp2,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                          opj_event_mgr_t *p_manager)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  uint unaff_EBX;
  uint unaff_R12D;
  OPJ_UINT32 l_value;
  uint local_54;
  uint local_44;
  opj_jp2_t *local_40;
  int local_38;
  OPJ_UINT32 local_34;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0xa93,
                  "OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0xa94,
                  "OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0xa95,
                  "OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((jp2->jp2_state & 2) == 0) {
    pcVar4 = "The  box must be the first box in the file.\n";
  }
  else {
    jp2->jp2_img_state = 0;
    if (p_header_size != 0) {
      iVar2 = 0;
      local_54 = 0;
      local_40 = jp2;
      do {
        local_38 = iVar2;
        if (p_header_size < 8) {
          pcVar4 = "Cannot handle box of less than 8 bytes\n";
LAB_00126fbd:
          opj_event_msg(p_manager,1,pcVar4);
          bVar1 = true;
        }
        else {
          opj_read_bytes_LE(p_header_data,&local_44,4);
          unaff_R12D = local_44;
          opj_read_bytes_LE(p_header_data + 4,&local_44,4);
          unaff_EBX = local_44;
          if (unaff_R12D != 0) {
            local_54 = 8;
            if (unaff_R12D == 1) {
              local_54 = 8;
              if (p_header_size < 0x10) {
                pcVar4 = "Cannot handle XL box of less than 16 bytes\n";
              }
              else {
                opj_read_bytes_LE(p_header_data + 8,&local_34,4);
                local_54 = 0xc;
                pcVar4 = "Cannot handle box sizes higher than 2^32\n";
                if (local_34 == 0) {
                  opj_read_bytes_LE(p_header_data + 0xc,&local_44,4);
                  unaff_R12D = local_44;
                  if (local_44 != 0) {
                    local_54 = 0x10;
                    goto LAB_00126fa1;
                  }
                  local_54 = 0x10;
                  pcVar4 = "Cannot handle box of undefined sizes\n";
                }
              }
            }
            else {
LAB_00126fa1:
              if (local_54 <= unaff_R12D) {
                bVar1 = false;
                goto LAB_00126fc6;
              }
              pcVar4 = "Box length is inconsistent.\n";
            }
            goto LAB_00126fbd;
          }
          opj_event_msg(p_manager,1,"Cannot handle box of undefined sizes\n");
          bVar1 = true;
          local_54 = 8;
        }
LAB_00126fc6:
        if (bVar1) {
          pcVar4 = "Stream error while reading JP2 Header box\n";
          goto LAB_001270a1;
        }
        if (p_header_size < unaff_R12D) {
          pcVar4 = "Stream error while reading JP2 Header box: box length is inconsistent.\n";
          goto LAB_001270a1;
        }
        lVar3 = 0;
        do {
          if (*(uint *)((long)&jp2_img_header[0].id + lVar3) == unaff_EBX) {
            lVar3 = (long)&jp2_img_header[0].id + lVar3;
            goto LAB_00126ff0;
          }
          lVar3 = lVar3 + 0x10;
        } while (lVar3 != 0x60);
        lVar3 = 0;
LAB_00126ff0:
        if (lVar3 == 0) {
          local_40->jp2_img_state = local_40->jp2_img_state | 0x7fffffff;
        }
        else {
          iVar2 = (**(code **)(lVar3 + 8))
                            (local_40,p_header_data + local_54,unaff_R12D - local_54,p_manager);
          if (iVar2 == 0) {
            return 0;
          }
        }
        iVar2 = local_38;
        if (unaff_EBX == 0x69686472) {
          iVar2 = 1;
        }
        p_header_data = p_header_data + local_54 + (unaff_R12D - local_54);
        p_header_size = p_header_size - unaff_R12D;
      } while (p_header_size != 0);
      if (iVar2 != 0) {
        *(byte *)&local_40->jp2_state = (byte)local_40->jp2_state | 4;
        local_40->has_jp2h = '\x01';
        return 1;
      }
    }
    pcVar4 = "Stream error while reading JP2 Header box: no \'ihdr\' box.\n";
  }
LAB_001270a1:
  opj_event_msg(p_manager,1,pcVar4);
  return 0;
}

Assistant:

static OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *jp2,
                                  OPJ_BYTE *p_header_data,
                                  OPJ_UINT32 p_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    OPJ_UINT32 l_box_size = 0, l_current_data_size = 0;
    opj_jp2_box_t box;
    const opj_jp2_header_handler_t * l_current_handler;
    OPJ_BOOL l_has_ihdr = 0;

    /* preconditions */
    assert(p_header_data != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);

    /* make sure the box is well placed */
    if ((jp2->jp2_state & JP2_STATE_FILE_TYPE) != JP2_STATE_FILE_TYPE) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "The  box must be the first box in the file.\n");
        return OPJ_FALSE;
    }

    jp2->jp2_img_state = JP2_IMG_STATE_NONE;

    /* iterate while remaining data */
    while (p_header_size > 0) {

        if (! opj_jp2_read_boxhdr_char(&box, p_header_data, &l_box_size, p_header_size,
                                       p_manager)) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Stream error while reading JP2 Header box\n");
            return OPJ_FALSE;
        }

        if (box.length > p_header_size) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Stream error while reading JP2 Header box: box length is inconsistent.\n");
            return OPJ_FALSE;
        }

        l_current_handler = opj_jp2_img_find_handler(box.type);
        l_current_data_size = box.length - l_box_size;
        p_header_data += l_box_size;

        if (l_current_handler != 00) {
            if (! l_current_handler->handler(jp2, p_header_data, l_current_data_size,
                                             p_manager)) {
                return OPJ_FALSE;
            }
        } else {
            jp2->jp2_img_state |= JP2_IMG_STATE_UNKNOWN;
        }

        if (box.type == JP2_IHDR) {
            l_has_ihdr = 1;
        }

        p_header_data += l_current_data_size;
        p_header_size -= box.length;
    }

    if (l_has_ihdr == 0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Stream error while reading JP2 Header box: no 'ihdr' box.\n");
        return OPJ_FALSE;
    }

    jp2->jp2_state |= JP2_STATE_HEADER;
    jp2->has_jp2h = 1;

    return OPJ_TRUE;
}